

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O3

void ss_mintrosort(sauchar_t *T,saidx_t *PA,saidx_t *first,saidx_t *last,saidx_t depth)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  sauchar_t *psVar6;
  sauchar_t *psVar7;
  byte bVar8;
  int iVar9;
  saint_t sVar10;
  uint *puVar11;
  uint *puVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint *puVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  uint *puVar23;
  uint *puVar24;
  sauchar_t *psVar25;
  int iVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  byte *pbVar31;
  saint_t sVar32;
  uint *puVar33;
  ulong uVar34;
  byte *pbVar35;
  ulong uVar36;
  long lVar37;
  byte *pbVar38;
  bool bVar39;
  bool bVar40;
  uint *local_210;
  ulong local_208;
  ulong auStack_1b8 [2];
  int aiStack_1a8 [94];
  ulong uVar22;
  
  uVar29 = (uint)((long)last - (long)first);
  if (((long)last - (long)first & 0x3fc00U) == 0) {
    sVar32 = *(saint_t *)((long)lg_table + (ulong)(uVar29 & 0x3fc));
  }
  else {
    sVar32 = *(int *)((long)lg_table + (ulong)(uVar29 >> 8 & 0x3fc)) + 8;
  }
  local_208 = 0;
LAB_001023fe:
  do {
    uVar36 = (long)last - (long)first;
    uVar34 = (long)uVar36 >> 2;
    iVar4 = sVar32;
    local_210 = (uint *)first;
    if ((long)uVar34 < 9) {
      local_208 = (ulong)(int)local_208;
      do {
        if ((1 < (long)uVar34) && (puVar12 = (uint *)last + -2, local_210 <= puVar12)) {
          psVar25 = T + depth;
          do {
            uVar29 = *puVar12;
            uVar30 = puVar12[1];
            puVar11 = puVar12 + 1;
            while( true ) {
              lVar27 = (long)PA[(int)uVar29];
              lVar37 = (long)PA[(int)uVar30];
              pbVar31 = psVar25 + lVar27;
              pbVar38 = psVar25 + lVar37;
              pbVar35 = T + (long)PA[(long)(int)uVar30 + 1] + 2;
              bVar39 = pbVar38 < pbVar35;
              bVar40 = pbVar31 < T + (long)PA[(long)(int)uVar29 + 1] + 2;
              puVar24 = puVar11;
              if ((bVar40) && (psVar6 = psVar25, pbVar38 < pbVar35)) {
                do {
                  bVar8 = psVar6[lVar27];
                  bVar28 = psVar6[lVar37];
                  if (bVar8 != bVar28) goto LAB_001024e4;
                  pbVar31 = psVar6 + lVar37 + 1;
                  bVar39 = pbVar31 < pbVar35;
                  psVar7 = psVar6 + 1;
                  bVar40 = psVar6 + lVar27 + 1 < T + (long)PA[(long)(int)uVar29 + 1] + 2;
                } while ((bVar40) && (psVar6 = psVar7, pbVar31 < pbVar35));
                pbVar31 = psVar7 + lVar27;
                pbVar38 = psVar7 + lVar37;
              }
              if (!bVar40) break;
              if (bVar39 != false) {
                bVar8 = *pbVar31;
                bVar28 = *pbVar38;
LAB_001024e4:
                iVar4 = (uint)bVar8 - (uint)bVar28;
                if (iVar4 == 0 || (uint)bVar8 < (uint)bVar28) goto LAB_00102516;
              }
              do {
                puVar11 = puVar24 + 1;
                puVar24[-1] = uVar30;
                if (last <= puVar11) goto LAB_0010251f;
                uVar30 = *puVar11;
                puVar24 = puVar11;
              } while ((int)uVar30 < 0);
            }
            iVar4 = -(uint)bVar39;
LAB_00102516:
            if (iVar4 == 0) {
              *puVar11 = ~uVar30;
            }
LAB_0010251f:
            puVar11[-1] = uVar29;
            puVar12 = puVar12 + -1;
          } while (local_210 <= puVar12);
        }
        bVar40 = local_208 == 0;
        local_208 = local_208 - 1;
        if (bVar40) {
          return;
        }
        local_210 = (uint *)auStack_1b8[local_208 * 3];
        last = (saidx_t *)auStack_1b8[local_208 * 3 + 1];
        depth = aiStack_1a8[local_208 * 6];
        uVar36 = (long)last - (long)local_210;
        uVar34 = (long)uVar36 >> 2;
      } while ((long)uVar34 < 9);
      iVar4 = aiStack_1a8[local_208 * 6 + 1];
    }
    sVar32 = iVar4 + -1;
    if (iVar4 == 0) {
      uVar30 = (uint)uVar34;
      uVar29 = uVar30;
      if ((uVar34 & 1) == 0) {
        uVar29 = uVar30 - 1;
        iVar9 = (int)((uVar30 - ((int)uVar29 >> 0x1f)) + -1) >> 1;
        uVar20 = local_210[(long)(int)uVar30 + -1];
        if (T[(long)PA[(int)local_210[iVar9]] + (long)depth] <
            T[(long)PA[(int)uVar20] + (long)depth]) {
          local_210[(long)(int)uVar30 + -1] = local_210[iVar9];
          local_210[iVar9] = uVar20;
        }
      }
      if (1 < (int)uVar29) {
        uVar16 = (ulong)(uVar29 >> 1);
        do {
          uVar17 = uVar16 - 1;
          uVar30 = local_210[uVar16 - 1];
          uVar22 = uVar16 * 2 - 1;
          if (uVar22 < uVar29) {
            bVar8 = T[(long)PA[(int)uVar30] + (long)depth];
            uVar15 = uVar16 * 2 - 2;
            uVar21 = uVar17;
            do {
              iVar26 = (int)uVar21;
              bVar28 = T[(long)PA[(int)local_210[(int)uVar22]] + (long)depth];
              bVar1 = T[(long)PA[(int)local_210[(long)(int)uVar15 + 2]] + (long)depth];
              bVar19 = bVar1;
              if (bVar1 < bVar28) {
                bVar19 = bVar28;
              }
              iVar9 = iVar26;
              if (bVar19 <= bVar8) break;
              uVar21 = uVar22;
              if (bVar28 < bVar1) {
                uVar21 = (ulong)((int)uVar15 + 2);
              }
              iVar9 = (int)uVar21;
              local_210[iVar26] = local_210[iVar9];
              uVar20 = iVar9 * 2 + 1;
              uVar22 = (ulong)uVar20;
              uVar15 = (ulong)(uint)(iVar9 * 2);
            } while ((int)uVar20 < (int)uVar29);
          }
          else {
            iVar9 = (int)uVar17;
          }
          local_210[iVar9] = uVar30;
          bVar40 = 1 < (long)uVar16;
          uVar16 = uVar17;
        } while (bVar40);
      }
      if ((uVar34 & 1) == 0) {
        uVar30 = *local_210;
        *local_210 = local_210[(int)uVar29];
        local_210[(int)uVar29] = uVar30;
        uVar30 = *local_210;
        if ((int)uVar29 < 2) {
          lVar27 = 0;
        }
        else {
          bVar8 = T[(long)PA[(int)uVar30] + (long)depth];
          iVar9 = 0;
          iVar5 = 1;
          iVar26 = 0;
          do {
            bVar28 = T[(long)PA[(int)local_210[iVar5]] + (long)depth];
            bVar1 = T[(long)PA[(int)local_210[(long)iVar9 + 2]] + (long)depth];
            bVar19 = bVar1;
            if (bVar1 < bVar28) {
              bVar19 = bVar28;
            }
            if (bVar19 <= bVar8) {
              lVar27 = (long)iVar26;
              break;
            }
            iVar14 = iVar5;
            if (bVar28 < bVar1) {
              iVar14 = iVar9 + 2;
            }
            lVar27 = (long)iVar14;
            local_210[iVar26] = local_210[lVar27];
            iVar9 = iVar14 * 2;
            iVar5 = iVar14 * 2 + 1;
            iVar26 = iVar14;
          } while (iVar5 < (int)uVar29);
        }
        local_210[lVar27] = uVar30;
      }
      if (1 < (int)uVar29) {
        uVar30 = *local_210;
        puVar12 = local_210 + ((ulong)uVar29 - 1);
        uVar20 = *puVar12;
        *local_210 = uVar20;
        uVar34 = (ulong)uVar29;
        while (uVar16 = uVar34 - 1, 1 < uVar16) {
          bVar8 = T[(long)PA[(int)uVar20] + (long)depth];
          iVar9 = 0;
          iVar5 = 1;
          iVar26 = 0;
          do {
            bVar28 = T[(long)PA[(int)local_210[iVar5]] + (long)depth];
            bVar1 = T[(long)PA[(int)local_210[(long)iVar9 + 2]] + (long)depth];
            bVar19 = bVar1;
            if (bVar1 < bVar28) {
              bVar19 = bVar28;
            }
            if (bVar19 <= bVar8) {
              lVar27 = (long)iVar26;
              break;
            }
            iVar14 = iVar5;
            if (bVar28 < bVar1) {
              iVar14 = iVar9 + 2;
            }
            lVar27 = (long)iVar14;
            local_210[iVar26] = local_210[lVar27];
            iVar9 = iVar14 * 2;
            iVar5 = iVar14 * 2 + 1;
            iVar26 = iVar14;
          } while ((long)iVar5 < (long)uVar16);
          local_210[lVar27] = uVar20;
          *puVar12 = uVar30;
          uVar30 = *local_210;
          puVar12 = local_210 + (uVar34 - 2);
          uVar20 = *puVar12;
          *local_210 = uVar20;
          uVar34 = uVar16;
        }
        *puVar12 = uVar30;
      }
    }
    if (iVar4 < 1) {
      lVar27 = (long)PA[(int)*local_210];
      bVar8 = T[lVar27 + depth];
      first = (saidx_t *)(local_210 + 1);
      puVar12 = local_210;
      if (first < last) {
        do {
          puVar11 = local_210;
          bVar28 = bVar8;
          if ((bVar8 != T[(long)PA[*first] + (long)depth]) &&
             (puVar11 = (uint *)first, bVar28 = T[(long)PA[*first] + (long)depth],
             4 < (long)(puVar12 + 1) - (long)local_210)) break;
          bVar8 = bVar28;
          local_210 = puVar11;
          first = (saidx_t *)((uint *)first + 1);
          puVar12 = puVar12 + 1;
        } while (first < last);
        lVar27 = (long)PA[(int)*local_210];
      }
      puVar12 = local_210;
      if (T[lVar27 + (long)depth + -1] < bVar8) {
        puVar12 = local_210 + -1;
        puVar11 = (uint *)first;
        do {
          while ((puVar12 = puVar12 + 1, puVar12 < puVar11 &&
                 (uVar29 = *puVar12, PA[(long)(int)uVar29 + 1] < PA[(int)uVar29] + depth))) {
            *puVar12 = ~uVar29;
          }
          do {
            puVar11 = puVar11 + -1;
            if (puVar11 <= puVar12) {
              if (local_210 < puVar12) {
                *local_210 = ~*local_210;
              }
              goto LAB_001031a4;
            }
            uVar29 = *puVar11;
          } while (PA[(int)uVar29] + depth <= PA[(long)(int)uVar29 + 1]);
          *puVar11 = *puVar12;
          *puVar12 = ~uVar29;
        } while( true );
      }
LAB_001031a4:
      uVar36 = (long)first - (long)puVar12;
      uVar34 = (long)uVar36 >> 2;
      lVar27 = (long)last - (long)first >> 2;
      bVar8 = (byte)(uVar34 >> 8);
      if (lVar27 < (long)uVar34) {
        if (1 < lVar27) {
          lVar27 = (long)(int)local_208;
          auStack_1b8[lVar27 * 3] = (ulong)puVar12;
          auStack_1b8[lVar27 * 3 + 1] = (ulong)first;
          aiStack_1a8[lVar27 * 6] = depth + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            sVar32 = lg_table[uVar34 & 0xff];
          }
          else {
            sVar32 = lg_table[bVar8] + 8;
          }
          local_208 = (ulong)((int)local_208 + 1);
          aiStack_1a8[lVar27 * 6 + 1] = sVar32;
          sVar32 = -1;
          goto LAB_001023fe;
        }
        if ((uVar36 & 0x3fc00) == 0) goto LAB_00103338;
LAB_0010326f:
        sVar32 = lg_table[bVar8] + 8;
      }
      else {
        sVar32 = -1;
        if ((long)uVar34 < 2) goto LAB_001023fe;
        lVar27 = (long)(int)local_208;
        auStack_1b8[lVar27 * 3] = (ulong)first;
        auStack_1b8[lVar27 * 3 + 1] = (ulong)last;
        aiStack_1a8[lVar27 * 6] = depth;
        local_208 = (ulong)((int)local_208 + 1);
        aiStack_1a8[lVar27 * 6 + 1] = -1;
        if ((uVar36 & 0x3fc00) != 0) goto LAB_0010326f;
LAB_00103338:
        sVar32 = lg_table[uVar34 & 0xff];
      }
      depth = depth + 1;
      last = first;
      first = (saidx_t *)puVar12;
      goto LAB_001023fe;
    }
    uVar29 = (uint)(uVar36 >> 2);
    puVar12 = local_210 + ((int)(((uint)(uVar36 >> 0x21) & 1) + uVar29) >> 1);
    if ((int)uVar29 < 0x201) {
      if ((int)uVar29 < 0x21) {
        uVar20 = *local_210;
        bVar8 = T[(long)PA[(int)uVar20] + (long)depth];
        uVar29 = *puVar12;
        bVar28 = T[(long)PA[(int)uVar29] + (long)depth];
        puVar18 = puVar12;
        uVar30 = uVar29;
        if (bVar28 < bVar8) {
          puVar18 = local_210;
          uVar30 = uVar20;
        }
        if (T[(long)PA[(int)((uint *)last)[-1]] + (long)depth] <
            T[(long)PA[(int)uVar30] + (long)depth]) {
          uVar30 = uVar20;
          if (bVar28 < bVar8) {
            uVar30 = uVar29;
          }
          if (bVar8 <= bVar28) {
            puVar12 = local_210;
          }
          puVar18 = puVar12;
          if (T[(long)PA[(int)uVar30] + (long)depth] <=
              T[(long)PA[(int)((uint *)last)[-1]] + (long)depth]) {
            puVar18 = (uint *)last + -1;
          }
        }
      }
      else {
        uVar34 = (ulong)(uint)((int)(uVar36 >> 4) << 2);
        puVar11 = (uint *)last + -1;
        puVar23 = (uint *)((long)puVar11 - uVar34);
        uVar29 = *(uint *)((long)local_210 + uVar34);
        puVar24 = (uint *)((long)local_210 + uVar34);
        puVar33 = puVar12;
        if (T[(long)PA[(int)*puVar12] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar33 = puVar24;
          uVar29 = *puVar12;
          puVar24 = puVar12;
        }
        uVar30 = *puVar23;
        puVar12 = puVar11;
        if (T[(long)PA[(int)((uint *)last)[-1]] + (long)depth] <
            T[(long)PA[(int)uVar30] + (long)depth]) {
          puVar12 = puVar23;
          uVar30 = ((uint *)last)[-1];
          puVar23 = puVar11;
        }
        puVar11 = puVar12;
        if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar11 = puVar33;
          puVar33 = puVar12;
          puVar23 = puVar24;
        }
        uVar20 = *local_210;
        puVar12 = puVar33;
        uVar29 = uVar20;
        puVar18 = local_210;
        if (T[(long)PA[(int)*puVar33] + (long)depth] < T[(long)PA[(int)uVar20] + (long)depth]) {
          puVar12 = local_210;
          uVar29 = *puVar33;
          puVar18 = puVar33;
        }
        if (T[(long)PA[(int)uVar29] + (long)depth] <= T[(long)PA[(int)*puVar23] + (long)depth]) {
          puVar18 = puVar23;
          puVar11 = puVar12;
        }
        if (T[(long)PA[(int)*puVar11] + (long)depth] <= T[(long)PA[(int)*puVar18] + (long)depth]) {
          puVar18 = puVar11;
        }
      }
    }
    else {
      uVar34 = uVar36 >> 5 & 0x1fffffff;
      puVar11 = local_210 + uVar34;
      uVar20 = *local_210;
      uVar30 = *puVar11;
      puVar24 = puVar11;
      uVar3 = uVar30;
      if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar20] + (long)depth]) {
        puVar24 = local_210;
        uVar3 = uVar20;
      }
      if (T[(long)PA[*(int *)((long)local_210 + (ulong)(uVar29 & 0xfffffff8))] + (long)depth] <
          T[(long)PA[(int)uVar3] + (long)depth]) {
        if (T[(long)PA[(int)uVar20] + (long)depth] <= T[(long)PA[(int)uVar30] + (long)depth]) {
          puVar11 = local_210;
          uVar30 = uVar20;
        }
        puVar24 = puVar11;
        if (T[(long)PA[(int)uVar30] + (long)depth] <=
            T[(long)PA[*(int *)((long)local_210 + (ulong)(uVar29 & 0xfffffff8))] + (long)depth]) {
          puVar24 = (uint *)((ulong)(uVar29 & 0xfffffff8) + (long)local_210);
        }
      }
      uVar36 = (ulong)(uint)((int)uVar34 * 4);
      puVar11 = (uint *)((long)puVar12 - uVar36);
      uVar29 = *puVar11;
      uVar30 = *puVar12;
      puVar23 = puVar12;
      uVar3 = uVar30;
      if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
        puVar23 = puVar11;
        uVar3 = uVar29;
      }
      if (T[(long)PA[*(int *)((long)puVar12 + uVar36)] + (long)depth] <
          T[(long)PA[(int)uVar3] + (long)depth]) {
        if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar11 = puVar12;
          uVar29 = uVar30;
        }
        puVar23 = puVar11;
        if (T[(long)PA[(int)uVar29] + (long)depth] <=
            T[(long)PA[*(int *)((long)puVar12 + uVar36)] + (long)depth]) {
          puVar23 = (uint *)(uVar36 + (long)puVar12);
        }
      }
      puVar12 = (uint *)((long)((uint *)last + -1) - (ulong)(uint)((int)uVar34 << 3));
      puVar18 = (uint *)last + (-1 - uVar34);
      uVar29 = *puVar12;
      uVar30 = *puVar18;
      puVar11 = puVar18;
      uVar3 = uVar30;
      if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
        puVar11 = puVar12;
        uVar3 = uVar29;
      }
      bVar8 = T[(long)PA[(int)uVar3] + (long)depth];
      if (T[(long)PA[(int)((uint *)last)[-1]] + (long)depth] < bVar8) {
        if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar12 = puVar18;
          uVar29 = uVar30;
        }
        puVar11 = (uint *)last + -1;
        if (T[(long)PA[(int)((uint *)last)[-1]] + (long)depth] <
            T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar11 = puVar12;
        }
        bVar8 = T[(long)PA[(int)*puVar11] + (long)depth];
      }
      uVar29 = *puVar24;
      uVar30 = *puVar23;
      puVar18 = puVar23;
      uVar3 = uVar30;
      if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
        puVar18 = puVar24;
        uVar3 = uVar29;
      }
      if (bVar8 < T[(long)PA[(int)uVar3] + (long)depth]) {
        if (T[(long)PA[(int)uVar30] + (long)depth] < T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar24 = puVar23;
          uVar29 = uVar30;
        }
        puVar18 = puVar11;
        if (bVar8 < T[(long)PA[(int)uVar29] + (long)depth]) {
          puVar18 = puVar24;
        }
      }
    }
    bVar8 = T[(long)PA[(int)*puVar18] + (long)depth];
    *local_210 = *puVar18;
    *puVar18 = uVar20;
    puVar12 = local_210;
    do {
      puVar24 = puVar12;
      puVar12 = puVar24 + 1;
      puVar23 = (uint *)last;
      puVar11 = puVar12;
      if (last <= puVar12) goto LAB_00102d0f;
    } while (T[(long)PA[(int)*puVar12] + (long)depth] == bVar8);
    if (T[(long)PA[(int)*puVar12] + (long)depth] < bVar8) {
      for (puVar11 = puVar24 + 2; puVar11 < last; puVar11 = puVar11 + 1) {
        uVar29 = *puVar11;
        if (bVar8 < T[(long)PA[(int)uVar29] + (long)depth]) break;
        if (T[(long)PA[(int)uVar29] + (long)depth] == bVar8) {
          *puVar11 = *puVar12;
          *puVar12 = uVar29;
          puVar12 = puVar12 + 1;
        }
      }
    }
LAB_00102d0f:
    do {
      puVar18 = puVar23;
      puVar23 = puVar18 + -1;
      puVar24 = puVar23;
      if (puVar23 <= puVar11) goto LAB_00102dc0;
    } while (T[(long)PA[(int)*puVar23] + (long)depth] == bVar8);
    if (bVar8 < T[(long)PA[(int)*puVar23] + (long)depth]) {
      for (puVar24 = puVar18 + -2; puVar11 < puVar24; puVar24 = puVar24 + -1) {
        uVar29 = *puVar24;
        if (T[(long)PA[(int)uVar29] + (long)depth] < bVar8) break;
        if (T[(long)PA[(int)uVar29] + (long)depth] == bVar8) {
          *puVar24 = *puVar23;
          *puVar23 = uVar29;
          puVar23 = puVar23 + -1;
        }
      }
    }
LAB_00102dc0:
    if (puVar11 < puVar24) {
      uVar29 = *puVar11;
      *puVar11 = *puVar24;
      *puVar24 = uVar29;
      while (puVar11 = puVar11 + 1, puVar11 < puVar24) {
        uVar29 = *puVar11;
        if (bVar8 < T[(long)PA[(int)uVar29] + (long)depth]) break;
        if (T[(long)PA[(int)uVar29] + (long)depth] == bVar8) {
          *puVar11 = *puVar12;
          *puVar12 = uVar29;
          puVar12 = puVar12 + 1;
        }
      }
LAB_00102daa:
      puVar24 = puVar24 + -1;
      if (puVar11 < puVar24) {
        uVar29 = *puVar24;
        if (T[(long)PA[(int)uVar29] + (long)depth] < bVar8) goto LAB_00102dc0;
        if (T[(long)PA[(int)uVar29] + (long)depth] == bVar8) {
          *puVar24 = *puVar23;
          *puVar23 = uVar29;
          puVar23 = puVar23 + -1;
        }
        goto LAB_00102daa;
      }
      goto LAB_00102dc0;
    }
    if (puVar23 < puVar12) {
      sVar32 = iVar4;
      if (T[(long)PA[(int)*local_210] + (long)depth + -1] < bVar8) {
        puVar12 = local_210 + -1;
        puVar11 = (uint *)last;
        do {
          while ((puVar12 = puVar12 + 1, puVar12 < puVar11 &&
                 (uVar29 = *puVar12, PA[(long)(int)uVar29 + 1] < PA[(int)uVar29] + depth))) {
            *puVar12 = ~uVar29;
          }
          do {
            puVar11 = puVar11 + -1;
            if (puVar11 <= puVar12) {
              if (local_210 < puVar12) {
                *local_210 = ~*local_210;
              }
              uVar29 = (uint)((long)last - (long)puVar12);
              local_210 = puVar12;
              if (((long)last - (long)puVar12 & 0x3fc00U) == 0) {
                sVar32 = *(saint_t *)((long)lg_table + (ulong)(uVar29 & 0x3fc));
              }
              else {
                sVar32 = *(int *)((long)lg_table + (ulong)(uVar29 >> 8 & 0x3fc)) + 8;
              }
              goto LAB_00103294;
            }
            uVar29 = *puVar11;
          } while (PA[(int)uVar29] + depth <= PA[(long)(int)uVar29 + 1]);
          *puVar11 = *puVar12;
          *puVar12 = ~uVar29;
        } while( true );
      }
LAB_00103294:
      depth = depth + 1;
      first = (saidx_t *)local_210;
    }
    else {
      lVar27 = (long)puVar11 - (long)puVar12 >> 2;
      uVar29 = (uint)((ulong)((long)puVar12 - (long)local_210) >> 2);
      if ((int)(uint)lVar27 <= (int)uVar29) {
        uVar29 = (uint)lVar27;
      }
      if (0 < (int)uVar29) {
        uVar30 = uVar29 + 1;
        lVar37 = 0;
        do {
          uVar2 = *(undefined4 *)((long)local_210 + lVar37);
          *(undefined4 *)((long)local_210 + lVar37) =
               *(undefined4 *)((long)puVar11 + lVar37 + (ulong)uVar29 * -4);
          *(undefined4 *)((long)puVar11 + lVar37 + (ulong)uVar29 * -4) = uVar2;
          uVar30 = uVar30 - 1;
          lVar37 = lVar37 + 4;
        } while (1 < uVar30);
      }
      lVar37 = (long)puVar23 - (long)(puVar11 + -1) >> 2;
      uVar29 = (int)((ulong)((long)last - (long)puVar23) >> 2) - 1;
      if ((int)(uint)lVar37 <= (int)uVar29) {
        uVar29 = (uint)lVar37;
      }
      if (0 < (int)uVar29) {
        uVar30 = uVar29 + 1;
        lVar13 = 0;
        do {
          uVar2 = *(undefined4 *)((long)puVar11 + lVar13);
          *(undefined4 *)((long)puVar11 + lVar13) =
               *(undefined4 *)((long)last + lVar13 + (ulong)uVar29 * -4);
          *(undefined4 *)((long)last + lVar13 + (ulong)uVar29 * -4) = uVar2;
          uVar30 = uVar30 - 1;
          lVar13 = lVar13 + 4;
        } while (1 < uVar30);
      }
      puVar12 = local_210 + lVar27;
      puVar11 = (uint *)last + -lVar37;
      first = (saidx_t *)puVar12;
      if (T[(long)PA[(int)*puVar12] + (long)depth + -1] < bVar8) {
        first = (saidx_t *)(puVar12 + -1);
        puVar24 = puVar11;
        do {
          while ((first = (saidx_t *)((uint *)first + 1), first < puVar24 &&
                 (uVar29 = *first, PA[(long)(int)uVar29 + 1] < PA[(int)uVar29] + depth))) {
            *first = ~uVar29;
          }
          do {
            puVar24 = puVar24 + -1;
            if (puVar24 <= first) {
              if (puVar12 < first) {
                *puVar12 = ~*puVar12;
              }
              goto LAB_00102f9b;
            }
            uVar29 = *puVar24;
          } while (PA[(int)uVar29] + depth <= PA[(long)(int)uVar29 + 1]);
          *puVar24 = *first;
          *first = ~uVar29;
        } while( true );
      }
LAB_00102f9b:
      uVar36 = (long)puVar11 - (long)first;
      uVar34 = (long)uVar36 >> 2;
      bVar8 = (byte)(uVar34 >> 8);
      if (lVar37 < lVar27) {
        if ((long)uVar34 < lVar27) {
          lVar27 = (long)(int)local_208;
          auStack_1b8[lVar27 * 3] = (ulong)local_210;
          auStack_1b8[lVar27 * 3 + 1] = (ulong)puVar12;
          aiStack_1a8[lVar27 * 6] = depth;
          aiStack_1a8[lVar27 * 6 + 1] = sVar32;
          lVar27 = (long)((int)local_208 + 1);
          if ((long)uVar34 < lVar37) {
            auStack_1b8[lVar27 * 3] = (ulong)puVar11;
            auStack_1b8[lVar27 * 3 + 1] = (ulong)last;
            aiStack_1a8[lVar27 * 6] = depth;
            aiStack_1a8[lVar27 * 6 + 1] = sVar32;
LAB_0010307e:
            local_208 = (ulong)((int)local_208 + 2);
            depth = depth + 1;
            last = (saidx_t *)puVar11;
            if ((uVar36 & 0x3fc00) == 0) {
              sVar32 = lg_table[uVar34 & 0xff];
            }
            else {
              sVar32 = lg_table[bVar8] + 8;
            }
          }
          else {
            auStack_1b8[lVar27 * 3] = (ulong)first;
            auStack_1b8[lVar27 * 3 + 1] = (ulong)puVar11;
            aiStack_1a8[lVar27 * 6] = depth + 1;
            if ((uVar36 & 0x3fc00) == 0) {
              sVar10 = lg_table[uVar34 & 0xff];
            }
            else {
              sVar10 = lg_table[bVar8] + 8;
            }
            local_208 = (ulong)((int)local_208 + 2);
            aiStack_1a8[lVar27 * 6 + 1] = sVar10;
            first = (saidx_t *)puVar11;
          }
        }
        else {
          lVar27 = (long)(int)local_208;
          auStack_1b8[lVar27 * 3] = (ulong)first;
          auStack_1b8[lVar27 * 3 + 1] = (ulong)puVar11;
          aiStack_1a8[lVar27 * 6] = depth + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            sVar10 = lg_table[uVar34 & 0xff];
          }
          else {
            sVar10 = lg_table[bVar8] + 8;
          }
          aiStack_1a8[lVar27 * 6 + 1] = sVar10;
          lVar27 = (long)((int)local_208 + 1);
          auStack_1b8[lVar27 * 3] = (ulong)local_210;
          auStack_1b8[lVar27 * 3 + 1] = (ulong)puVar12;
          aiStack_1a8[lVar27 * 6] = depth;
          local_208 = (ulong)((int)local_208 + 2);
          aiStack_1a8[lVar27 * 6 + 1] = sVar32;
          first = (saidx_t *)puVar11;
        }
      }
      else {
        lVar13 = (long)(int)local_208;
        if ((long)uVar34 < lVar37) {
          auStack_1b8[lVar13 * 3] = (ulong)puVar11;
          auStack_1b8[lVar13 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar13 * 6] = depth;
          aiStack_1a8[lVar13 * 6 + 1] = sVar32;
          lVar37 = (long)((int)local_208 + 1);
          if ((long)uVar34 < lVar27) {
            auStack_1b8[lVar37 * 3] = (ulong)local_210;
            auStack_1b8[lVar37 * 3 + 1] = (ulong)puVar12;
            aiStack_1a8[lVar37 * 6] = depth;
            aiStack_1a8[lVar37 * 6 + 1] = sVar32;
            goto LAB_0010307e;
          }
          auStack_1b8[lVar37 * 3] = (ulong)first;
          auStack_1b8[lVar37 * 3 + 1] = (ulong)puVar11;
          aiStack_1a8[lVar37 * 6] = depth + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            sVar10 = lg_table[uVar34 & 0xff];
          }
          else {
            sVar10 = lg_table[bVar8] + 8;
          }
          aiStack_1a8[lVar37 * 6 + 1] = sVar10;
        }
        else {
          auStack_1b8[lVar13 * 3] = (ulong)first;
          auStack_1b8[lVar13 * 3 + 1] = (ulong)puVar11;
          aiStack_1a8[lVar13 * 6] = depth + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            sVar10 = lg_table[uVar34 & 0xff];
          }
          else {
            sVar10 = lg_table[bVar8] + 8;
          }
          aiStack_1a8[lVar13 * 6 + 1] = sVar10;
          lVar27 = (long)((int)local_208 + 1);
          auStack_1b8[lVar27 * 3] = (ulong)puVar11;
          auStack_1b8[lVar27 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar27 * 6] = depth;
          aiStack_1a8[lVar27 * 6 + 1] = sVar32;
        }
        local_208 = (ulong)((int)local_208 + 2);
        last = (saidx_t *)puVar12;
        first = (saidx_t *)local_210;
      }
    }
  } while( true );
}

Assistant:

static
void
ss_mintrosort(const sauchar_t *T, const saidx_t *PA,
              saidx_t *first, saidx_t *last,
              saidx_t depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { saidx_t *a, *b, c; saint_t d; } stack[STACK_SIZE];
  const sauchar_t *Td;
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t s, t;
  saint_t ssize;
  saint_t limit;
  saint_t v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}